

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_loader.c
# Opt level: O1

void image_load(char *filename,uchar *image_data,int *image_width,int *image_height)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  long lVar3;
  list *plVar4;
  list **pplVar5;
  char magic [4];
  undefined4 local_44;
  int *local_40;
  int *local_38;
  
  if (filename != (char *)0x0) {
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      pplVar5 = (list **)0x0;
      printf("fopen %s failed\n",filename);
    }
    else {
      local_44 = 0;
      sVar2 = fread(&local_44,4,1,__stream);
      if (sVar2 == 1) {
        local_40 = image_width;
        local_38 = image_height;
        fclose(__stream);
        pplVar5 = (list **)0x0;
        plVar4 = &loader_list;
        do {
          plVar4 = plVar4->next;
          image_width = local_40;
          image_height = local_38;
          if (plVar4 == &loader_list) goto LAB_0010803b;
          iVar1 = bcmp(&local_44,plVar4[-3].prev,(long)*(int *)&plVar4[-2].next);
        } while (iVar1 != 0);
        pplVar5 = &plVar4[-3].prev;
        image_width = local_40;
        image_height = local_38;
      }
      else {
        puts("fread failed");
        pplVar5 = (list **)0x0;
      }
    }
LAB_0010803b:
    if ((pplVar5 != (list **)0x0) &&
       (lVar3 = (*(code *)pplVar5[2])(filename,image_width,image_height), lVar3 != 0)) {
      if (image_data != (uchar *)0x0) {
        (*(code *)pplVar5[3])(lVar3,image_data);
      }
      (*(code *)pplVar5[4])(lVar3);
      if (lVar3 != 0) {
        return;
      }
    }
  }
  *image_width = 0x200;
  *image_height = 0x200;
  if (image_data == (uchar *)0x0) {
    return;
  }
  memcpy(image_data,tux_image.pixel_data,0x100000);
  return;
}

Assistant:

void image_load(char *filename, unsigned char *image_data, int *image_width, int *image_height)
{
  char magic[4];
  loader_t *loader = NULL;
  struct list *loader_entry = NULL;

  if (filename) {
    if (magic_read(filename, magic, sizeof(magic)) != -1) {
      LIST_FOR_EACH(loader_entry, &loader_list) {
        loader = LIST_ENTRY(loader_entry, loader_t, entry);
        if (!memcmp(magic, loader->magic, loader->magic_size)) {
          break;
        }
        loader = NULL;
      }
    }

    if (loader) {
      if (image_read(filename, loader, image_data, image_width, image_height) == -1) {
        loader = NULL;
      }
    }
  }

  if (!loader) {
    *image_width = tux_image.width;
    *image_height = tux_image.height;
    if (image_data) {
      memcpy(image_data, (unsigned char *)tux_image.pixel_data, tux_image.width * tux_image.height * 4);
    }
  }
}